

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O0

void __thiscall antlr::CharScanner::resetText(CharScanner *this)

{
  int iVar1;
  LexerInputState *pLVar2;
  long in_RDI;
  
  std::__cxx11::string::operator=((string *)(in_RDI + 8),"");
  pLVar2 = RefCount<antlr::LexerInputState>::operator->
                     ((RefCount<antlr::LexerInputState> *)(in_RDI + 0x78));
  iVar1 = pLVar2->column;
  pLVar2 = RefCount<antlr::LexerInputState>::operator->
                     ((RefCount<antlr::LexerInputState> *)(in_RDI + 0x78));
  pLVar2->tokenStartColumn = iVar1;
  pLVar2 = RefCount<antlr::LexerInputState>::operator->
                     ((RefCount<antlr::LexerInputState> *)(in_RDI + 0x78));
  iVar1 = pLVar2->line;
  pLVar2 = RefCount<antlr::LexerInputState>::operator->
                     ((RefCount<antlr::LexerInputState> *)(in_RDI + 0x78));
  pLVar2->tokenStartLine = iVar1;
  return;
}

Assistant:

virtual void resetText()
	{
		text = "";
		inputState->tokenStartColumn = inputState->column;
		inputState->tokenStartLine = inputState->line;
	}